

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::DescriptorSet>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters *params)

{
  PlatformInterface *pPVar1;
  long *plVar2;
  pointer pSVar3;
  Context *this;
  VkAllocationCallbacks *allocator;
  DeviceInterface *vk;
  VkDevice device;
  size_t sVar4;
  size_t sVar5;
  char *__s;
  size_t sVar6;
  deUint64 *pdVar7;
  long *plVar8;
  int *piVar9;
  ulong uVar10;
  long lVar11;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  objects;
  Resources res;
  Environment env;
  Resources res_1;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  local_2f8;
  deUint64 dStack_2e0;
  TestStatus *local_2d0;
  Context *local_2c8;
  ulong local_2c0;
  undefined1 local_2b8 [24];
  VkDescriptorPool VStack_2a0;
  VkDescriptorSetLayout *local_298;
  Move<vk::Handle<(vk::HandleType)22>_> local_290;
  undefined1 local_270 [136];
  PlatformInterface *local_1e8;
  DeviceInterface *local_1e0;
  VkDevice local_1d8;
  deUint32 local_1d0;
  ProgramCollection<vk::ProgramBinary> *local_1c8;
  undefined1 *local_1c0;
  undefined4 local_1b8;
  undefined1 local_1b0 [8];
  Handle<(vk::HandleType)21> local_1a8;
  VkDescriptorPool local_1a0;
  deUint32 local_198;
  VkAllocationCallbacks *local_190;
  VkDescriptorSetLayout local_148 [2];
  ios_base local_138 [264];
  
  local_2d0 = __return_storage_ptr__;
  allocator = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_270,allocator,0x400);
  pPVar1 = context->m_platformInterface;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  local_1d0 = Context::getUniversalQueueFamilyIndex(context);
  local_1c8 = context->m_progCollection;
  local_1c0 = local_270 + 8;
  local_1b8 = 1;
  local_2c8 = context;
  local_1e8 = pPVar1;
  local_1e0 = vk;
  local_1d8 = device;
  DescriptorSet::Resources::Resources((Resources *)local_1b0,(Environment *)&local_1e8,params);
  sVar4 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_270);
  local_2b8._0_4_ = 0x22;
  local_2b8._8_8_ = (DeviceInterface *)0x0;
  local_298 = local_148;
  local_2b8._16_8_ = local_1a8.m_internal;
  VStack_2a0.m_internal._0_4_ = 1;
  ::vk::allocateDescriptorSet(&local_290,vk,device,(VkDescriptorSetAllocateInfo *)local_2b8);
  local_2f8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_290.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
  local_2f8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)local_290.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
                m_deviceIface;
  local_2f8.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)local_290.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device;
  dStack_2e0 = local_290.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
               m_internal;
  sVar5 = getCurrentSystemMemoryUsage((AllocationCallbackRecorder *)local_270);
  this = local_2c8;
  if (local_2f8.
      super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    local_2b8._0_8_ =
         local_2f8.
         super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (*(code *)(local_2f8.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->m_ptr[0xf].
              super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface)
              (local_2f8.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               local_2f8.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,dStack_2e0,1);
  }
  DescriptorSet::Resources::~Resources((Resources *)local_1b0);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder
            ((AllocationCallbackRecorder *)local_270);
  sVar4 = getSafeObjectCount((Context *)this->m_testCtx->m_platform,sVar5 - sVar4,0);
  local_2c0 = 0x4000;
  if (sVar4 < 0x4000) {
    local_2c0 = sVar4;
  }
  local_1e8 = this->m_platformInterface;
  local_1e0 = Context::getDeviceInterface(this);
  local_1d8 = Context::getDevice(this);
  local_1d0 = Context::getUniversalQueueFamilyIndex(this);
  local_1c8 = this->m_progCollection;
  local_1c0 = (undefined1 *)0x0;
  local_1b8 = (undefined4)local_2c0;
  DescriptorSet::Resources::Resources((Resources *)local_270,(Environment *)&local_1e8,params);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::vector(&local_2f8,local_2c0,(allocator_type *)local_1b0);
  local_1b0 = (undefined1  [8])this->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Creating ",9);
  std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," ",1);
  __s = ::vk::getTypeName<vk::Handle<(vk::HandleType)22>>();
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_1a8 +
                    (int)*(undefined8 *)(local_1a8.m_internal - 0x18));
  }
  else {
    sVar6 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,__s,sVar6);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," objects",8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  if (sVar4 != 0) {
    lVar11 = 8;
    uVar10 = 0;
    do {
      pdVar7 = (deUint64 *)operator_new(0x20);
      local_1b0._0_4_ = 0x22;
      local_1a8.m_internal = 0;
      local_1a0.m_internal = local_270._8_8_;
      local_198 = 1;
      local_190 = (VkAllocationCallbacks *)(local_270 + 0x68);
      ::vk::allocateDescriptorSet
                ((Move<vk::Handle<(vk::HandleType)22>_> *)local_2b8,local_1e0,local_1d8,
                 (VkDescriptorSetAllocateInfo *)local_1b0);
      pdVar7[2] = local_2b8._16_8_;
      pdVar7[3] = VStack_2a0.m_internal;
      *pdVar7 = local_2b8._0_8_;
      pdVar7[1] = local_2b8._8_8_;
      local_2b8._0_8_ = (pointer)0x0;
      local_2b8._8_8_ = (DeviceInterface *)0x0;
      local_2b8._16_8_ = 0;
      VStack_2a0.m_internal = 0;
      plVar8 = (long *)operator_new(0x20);
      pSVar3 = local_2f8.
               super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(plVar8 + 1) = 0;
      *(undefined4 *)((long)plVar8 + 0xc) = 0;
      *plVar8 = (long)&PTR__SharedPtrState_00cef4f0;
      plVar8[2] = (long)pdVar7;
      *(undefined4 *)(plVar8 + 1) = 1;
      *(undefined4 *)((long)plVar8 + 0xc) = 1;
      plVar2 = *(long **)((long)&(local_2f8.
                                  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar11);
      if (plVar2 != plVar8) {
        if (plVar2 != (long *)0x0) {
          LOCK();
          plVar2 = plVar2 + 1;
          *(int *)plVar2 = (int)*plVar2 + -1;
          UNLOCK();
          if ((int)*plVar2 == 0) {
            *(undefined8 *)
             ((long)local_2f8.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + lVar11 + -8) = 0;
            (**(code **)(**(long **)((long)&(local_2f8.
                                             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->m_ptr +
                                    lVar11) + 0x10))();
          }
          LOCK();
          piVar9 = (int *)(*(long *)((long)&pSVar3->m_ptr + lVar11) + 0xc);
          *piVar9 = *piVar9 + -1;
          UNLOCK();
          if (*piVar9 == 0) {
            plVar2 = *(long **)((long)&pSVar3->m_ptr + lVar11);
            if (plVar2 != (long *)0x0) {
              (**(code **)(*plVar2 + 8))();
            }
            *(undefined8 *)((long)&pSVar3->m_ptr + lVar11) = 0;
          }
        }
        *(deUint64 **)((long)pSVar3 + lVar11 + -8) = pdVar7;
        *(long **)((long)&pSVar3->m_ptr + lVar11) = plVar8;
        LOCK();
        *(int *)(plVar8 + 1) = (int)plVar8[1] + 1;
        UNLOCK();
        LOCK();
        piVar9 = (int *)(*(long *)((long)&pSVar3->m_ptr + lVar11) + 0xc);
        *piVar9 = *piVar9 + 1;
        UNLOCK();
      }
      plVar2 = plVar8 + 1;
      LOCK();
      *(int *)plVar2 = (int)*plVar2 + -1;
      UNLOCK();
      if ((int)*plVar2 == 0) {
        (**(code **)(*plVar8 + 0x10))(plVar8);
      }
      piVar9 = (int *)((long)plVar8 + 0xc);
      LOCK();
      *piVar9 = *piVar9 + -1;
      UNLOCK();
      if (*piVar9 == 0) {
        (**(code **)(*plVar8 + 8))(plVar8);
      }
      if ((pointer)local_2b8._0_8_ != (pointer)0x0) {
        local_1b0 = (undefined1  [8])local_2b8._0_8_;
        (*(*(_func_int ***)local_2b8._8_8_)[0x3d])
                  (local_2b8._8_8_,local_2b8._16_8_,VStack_2a0.m_internal,1,local_1b0);
      }
      if ((uVar10 & 0x3ff) == 0 && uVar10 != 0) {
        tcu::TestContext::touchWatchdog(local_2c8->m_testCtx);
      }
      uVar10 = uVar10 + 1;
      lVar11 = lVar11 + 0x10;
    } while (local_2c0 != uVar10);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::_M_erase_at_end(&local_2f8,
                    local_2f8.
                    super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  local_1b0 = (undefined1  [8])&local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"Ok","");
  local_2d0->m_code = QP_TEST_RESULT_PASS;
  (local_2d0->m_description)._M_dataplus._M_p = (pointer)&(local_2d0->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0->m_description,local_1b0,
             (long)(deUint64 *)local_1b0 + local_1a8.m_internal);
  if (local_1b0 != (undefined1  [8])&local_1a0) {
    operator_delete((void *)local_1b0,(ulong)(local_1a0.m_internal + 1));
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)22>_>_>_>_>
  ::~vector(&local_2f8);
  DescriptorSet::Resources::~Resources((Resources *)local_270);
  return local_2d0;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}